

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_zeroing<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
               (void)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_418;
  basic_cstring<const_char> local_408;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3f8;
  assertion_result local_3d8;
  basic_cstring<const_char> local_3c0;
  basic_cstring<const_char> local_3b0;
  basic_cstring<const_char> local_3a0;
  basic_cstring<const_char> local_390;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_380;
  assertion_result local_360;
  basic_cstring<const_char> local_348;
  basic_cstring<const_char> local_338;
  basic_cstring<const_char> local_328;
  basic_cstring<const_char> local_318;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_308;
  assertion_result local_2e8;
  basic_cstring<const_char> local_2d0;
  basic_cstring<const_char> local_2c0;
  basic_cstring<const_char> local_2b0;
  basic_cstring<const_char> local_2a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_290;
  assertion_result local_270;
  basic_cstring<const_char> local_258;
  basic_cstring<const_char> local_248;
  basic_cstring<const_char> local_238;
  basic_cstring<const_char> local_228;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_218;
  assertion_result local_1f8;
  basic_cstring<const_char> local_1e0;
  basic_cstring<const_char> local_1d0;
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1a0;
  assertion_result local_180;
  basic_cstring<const_char> local_168;
  basic_cstring<const_char> local_158 [2];
  undefined1 local_138 [8];
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_> m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
  Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Boundary_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
              *)local_138,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.colSettings_,5);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_158,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_168);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_158,0x26d,&local_168);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
            ::is_zero_entry((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
                             *)local_138,3,1);
    boost::test_tools::assertion_result::assertion_result(&local_180,(bool)(~bVar2 & 1));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,"!m.is_zero_entry(3, 1)",0x16);
    boost::unit_test::operator<<(&local_1a0,plVar3,&local_1b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_180,&local_1a0,&local_1c0,0x26d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1a0);
    boost::test_tools::assertion_result::~assertion_result(&local_180);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1d0,0x26e,&local_1e0);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
            ::is_zero_column((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
                              *)local_138,3);
    boost::test_tools::assertion_result::assertion_result(&local_1f8,(bool)(~bVar2 & 1));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_228,"!m.is_zero_column(3)",0x14);
    boost::unit_test::operator<<(&local_218,plVar3,&local_228);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_238,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1f8,&local_218,&local_238,0x26e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_218);
    boost::test_tools::assertion_result::~assertion_result(&local_1f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>::
  zero_entry((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
              *)local_138,3,1);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_258);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0x270,&local_258);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
            ::is_zero_entry((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
                             *)local_138,3,1);
    boost::test_tools::assertion_result::assertion_result(&local_270,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2a0,"m.is_zero_entry(3, 1)",0x15);
    boost::unit_test::operator<<(&local_290,plVar3,&local_2a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_270,&local_290,&local_2b0,0x270,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_290);
    boost::test_tools::assertion_result::~assertion_result(&local_270);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2c0,0x271,&local_2d0);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
            ::is_zero_column((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
                              *)local_138,3);
    boost::test_tools::assertion_result::assertion_result(&local_2e8,(bool)(~bVar2 & 1));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_318,"!m.is_zero_column(3)",0x14);
    boost::unit_test::operator<<(&local_308,plVar3,&local_318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_328,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_2e8,&local_308,&local_328,0x271,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_308);
    boost::test_tools::assertion_result::~assertion_result(&local_2e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>::
  zero_column((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
               *)local_138,3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_348);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_338,0x273,&local_348);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
            ::is_zero_entry((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
                             *)local_138,3,1);
    boost::test_tools::assertion_result::assertion_result(&local_360,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_390,"m.is_zero_entry(3, 1)",0x15);
    boost::unit_test::operator<<(&local_380,plVar3,&local_390);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_360,&local_380,&local_3a0,0x273,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_380);
    boost::test_tools::assertion_result::~assertion_result(&local_360);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3b0,0x274,&local_3c0);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
            ::is_zero_column((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
                              *)local_138,3);
    boost::test_tools::assertion_result::assertion_result(&local_3d8,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_408,"m.is_zero_column(3)",0x13);
    boost::unit_test::operator<<(&local_3f8,plVar3,&local_408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_418,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_3d8,&local_3f8,&local_418,0x274,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_3f8);
    boost::test_tools::assertion_result::~assertion_result(&local_3d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>::
  ~Matrix((Matrix<Boundary_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
           *)local_138);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.colSettings_);
  return;
}

Assistant:

void test_zeroing() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  Matrix m(orderedBoundaries, 5);

  BOOST_CHECK(!m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_entry(3, 1);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_column(3);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(m.is_zero_column(3));
}